

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O2

void aom_highbd_quantize_b_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  short sVar1;
  undefined1 auVar2 [32];
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  int i;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  __m256i *qcoeff1;
  __m256i *qcoeff0;
  undefined1 auVar17 [32];
  __m128i mask;
  __m128i mask_00;
  __m256i quant;
  __m256i mask0;
  __m256i shift;
  __m256i round;
  int local_2f0;
  int local_2ec;
  uint local_2e8 [2];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  __m256i local_2a0;
  __m256i local_280;
  int16_t *local_250;
  intptr_t local_248;
  __m256i local_240;
  __m256i local_220;
  __m256i local_200;
  undefined1 local_1e0 [32];
  __m256i local_1c0;
  __m256i local_1a0;
  longlong local_180;
  longlong lStack_178;
  longlong lStack_170;
  longlong lStack_168;
  __m256i local_160;
  __m256i local_140;
  __m256i local_120;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  __m256i local_a0 [3];
  
  local_2ec = 0;
  local_180 = 0;
  lStack_178 = 0;
  lStack_170 = 0;
  lStack_168 = 0;
  local_2f0 = 0;
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    local_2e8[lVar13] = ((dequant_ptr[lVar13] * 0x145 + 0x40 >> 7) + zbin_ptr[lVar13] * 0x20) - 1;
  }
  auVar17._4_4_ = local_2e8[1];
  auVar17._0_4_ = local_2e8[1];
  auVar17._8_4_ = local_2e8[1];
  auVar17._12_4_ = local_2e8[1];
  auVar17._16_4_ = local_2e8[1];
  auVar17._20_4_ = local_2e8[1];
  auVar17._24_4_ = local_2e8[1];
  auVar17._28_4_ = local_2e8[1];
  local_a0[0] = (__m256i)vblendps_avx(auVar17,ZEXT432(local_2e8[0]),1);
  local_2e0 = vpmovsxwd_avx2(*(undefined1 (*) [16])zbin_ptr);
  local_1c0 = (__m256i)vpmovsxwd_avx2(*(undefined1 (*) [16])round_ptr);
  local_200 = (__m256i)vpmovsxwd_avx2(*(undefined1 (*) [16])quant_ptr);
  local_220 = (__m256i)vpmovsxwd_avx2(*(undefined1 (*) [16])dequant_ptr);
  local_240 = (__m256i)vpmovsxwd_avx2(*(undefined1 (*) [16])quant_shift_ptr);
  local_c0 = *(undefined1 (*) [32])coeff_ptr;
  local_280 = (__m256i)vpabsd_avx2(local_c0);
  qcoeff0 = &local_280;
  local_e0 = *(undefined1 (*) [32])(coeff_ptr + 8);
  local_2a0 = (__m256i)vpabsd_avx2(local_e0);
  qcoeff1 = &local_2a0;
  auVar17 = ZEXT1632(local_2a0._0_16_);
  local_250 = zbin_ptr;
  local_248 = n_coeffs;
  local_1e0 = (undefined1  [32])local_2a0;
  local_1a0 = local_200;
  local_160 = local_240;
  local_140 = local_280;
  local_120 = local_1c0;
  highbd_update_mask0_avx2(qcoeff0,qcoeff1,local_a0,iscan,&local_2ec,(__m256i *)&local_180);
  auVar9 = local_1e0;
  auVar2 = vpcmpgtd_avx2(local_2e0,(undefined1  [32])local_140);
  auVar17 = vpcmpeqd_avx2(auVar17,auVar17);
  auVar5 = vpshufd_avx2(local_2e0,0xee);
  local_140 = (__m256i)vpaddd_avx2(auVar5,auVar17);
  local_2c0 = vpcmpgtd_avx2(local_1e0,(undefined1  [32])local_140);
  auVar17 = vpackssdw_avx2(auVar2 ^ auVar17,local_2c0);
  uVar10 = (uint)(SUB321(auVar17 >> 7,0) & 1) | (uint)(SUB321(auVar17 >> 0xf,0) & 1) << 1 |
           (uint)(SUB321(auVar17 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar17 >> 0x1f,0) & 1) << 3 |
           (uint)(SUB321(auVar17 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar17 >> 0x2f,0) & 1) << 5 |
           (uint)(SUB321(auVar17 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar17 >> 0x3f,0) & 1) << 7 |
           (uint)(SUB321(auVar17 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar17 >> 0x4f,0) & 1) << 9 |
           (uint)(SUB321(auVar17 >> 0x57,0) & 1) << 10 |
           (uint)(SUB321(auVar17 >> 0x5f,0) & 1) << 0xb |
           (uint)(SUB321(auVar17 >> 0x67,0) & 1) << 0xc |
           (uint)(SUB321(auVar17 >> 0x6f,0) & 1) << 0xd |
           (uint)(SUB321(auVar17 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar17 >> 0x7f,0) << 0xf |
           (uint)(SUB321(auVar17 >> 0x87,0) & 1) << 0x10 |
           (uint)(SUB321(auVar17 >> 0x8f,0) & 1) << 0x11 |
           (uint)(SUB321(auVar17 >> 0x97,0) & 1) << 0x12 |
           (uint)(SUB321(auVar17 >> 0x9f,0) & 1) << 0x13 |
           (uint)(SUB321(auVar17 >> 0xa7,0) & 1) << 0x14 |
           (uint)(SUB321(auVar17 >> 0xaf,0) & 1) << 0x15 |
           (uint)(SUB321(auVar17 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar17 >> 0xbf,0) << 0x17 |
           (uint)(SUB321(auVar17 >> 199,0) & 1) << 0x18 |
           (uint)(SUB321(auVar17 >> 0xcf,0) & 1) << 0x19 |
           (uint)(SUB321(auVar17 >> 0xd7,0) & 1) << 0x1a |
           (uint)(SUB321(auVar17 >> 0xdf,0) & 1) << 0x1b |
           (uint)(SUB321(auVar17 >> 0xe7,0) & 1) << 0x1c |
           (uint)(SUB321(auVar17 >> 0xef,0) & 1) << 0x1d |
           (uint)(SUB321(auVar17 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar17[0x1f] >> 7) << 0x1f;
  local_1e0._1_3_ = (int3)(uVar10 >> 8);
  local_1e0[0] = uVar10 == 0;
  local_1e0._4_28_ = auVar9._4_28_;
  if (uVar10 == 0) {
    auVar17 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar17;
    *(undefined1 (*) [32])qcoeff_ptr = auVar17;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar17;
    local_120 = (__m256i)vpermilps_avx((undefined1  [32])local_1c0,0xee);
    local_200 = (__m256i)vpermilps_avx((undefined1  [32])local_1a0,0xee);
    local_160 = (__m256i)vpermilps_avx((undefined1  [32])local_240,0xee);
    local_2c0 = vpshufd_avx2((undefined1  [32])local_220,0xee);
    local_2e0 = ZEXT1632(ZEXT816(0));
  }
  else {
    auVar17 = vpermq_avx2(auVar17,0xd8);
    auVar17 = vpand_avx2(auVar17,*(undefined1 (*) [32])iscan);
    local_2e0 = vpmaxsw_avx2(auVar17,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    qcoeff1 = &local_120;
    local_100 = auVar2;
    highbd_calculate_qcoeff_avx2(&local_280,qcoeff1,&local_200,&local_160,&local_2f0);
    local_120 = (__m256i)vpermilps_avx((undefined1  [32])local_1c0,0xee);
    local_200 = (__m256i)vpermilps_avx((undefined1  [32])local_1a0,0xee);
    local_160 = (__m256i)vpermilps_avx((undefined1  [32])local_240,0xee);
    qcoeff0 = &local_2a0;
    highbd_calculate_qcoeff_avx2(qcoeff0,qcoeff1,&local_200,&local_160,&local_2f0);
    local_280 = (__m256i)vpsignd_avx2((undefined1  [32])local_280,local_c0);
    auVar17 = vpsignd_avx2((undefined1  [32])local_2a0,local_e0);
    auVar2 = vpandn_avx2(local_100,(undefined1  [32])local_280);
    auVar17 = vpand_avx2(auVar17,local_2c0);
    *(undefined1 (*) [32])qcoeff_ptr = auVar2;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar17;
    auVar2 = vpmulld_avx2(auVar2,(undefined1  [32])local_220);
    local_2c0 = vpshufd_avx2((undefined1  [32])local_220,0xee);
    auVar17 = vpmulld_avx2(auVar17,local_2c0);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar2;
  }
  *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar17;
  lVar13 = 0x10;
LAB_00317f2c:
  lVar16 = (long)(int)lVar13 * 2;
  lVar6 = (long)(int)lVar13;
  while (lVar13 = lVar6 + 0x10, lVar6 < local_248) {
    local_1a0 = *(__m256i *)(coeff_ptr + lVar6);
    local_280 = (__m256i)vpabsd_avx2((undefined1  [32])local_1a0);
    local_1c0 = *(__m256i *)(coeff_ptr + lVar6 + 8);
    local_2a0 = (__m256i)vpabsd_avx2((undefined1  [32])local_1c0);
    qcoeff0 = &local_280;
    qcoeff1 = &local_2a0;
    local_240 = local_2a0;
    local_220 = local_280;
    highbd_update_mask0_avx2
              (qcoeff0,qcoeff1,local_a0,(int16_t *)((long)iscan + lVar16),&local_2ec,
               (__m256i *)&local_180);
    alVar3 = (__m256i)vpcmpgtd_avx2((undefined1  [32])local_220,(undefined1  [32])local_140);
    alVar4 = (__m256i)vpcmpgtd_avx2((undefined1  [32])local_240,(undefined1  [32])local_140);
    auVar17 = vpackssdw_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar4);
    if ((((((((((((((((((((((((((((((((auVar17 >> 7 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar17 >> 0xf & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar17 >> 0x17 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar17 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar17 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar17 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar17 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar17 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar17 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar17 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar17 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar17 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar17 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar17 >> 0x7f,0) != '\0') ||
                      (auVar17 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar17 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar17 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar17 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar17 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar17 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0xbf,0) != '\0') ||
              (auVar17 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar17 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar17 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar17 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         (auVar17 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
        (auVar17 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    goto LAB_00318031;
    auVar17 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    local_2e0 = vpmaxsw_avx2(local_2e0,auVar17);
    *(undefined1 (*) [32])(qcoeff_ptr + lVar6 + 8) = auVar17;
    *(undefined1 (*) [32])(qcoeff_ptr + lVar6) = auVar17;
    *(undefined1 (*) [32])(dqcoeff_ptr + lVar6 + 8) = auVar17;
    *(undefined1 (*) [32])(dqcoeff_ptr + lVar6) = auVar17;
    lVar16 = lVar16 + 0x20;
    lVar6 = lVar13;
  }
  if (local_2ec == 0) {
    uVar10 = 0;
  }
  else {
    auVar7._8_8_ = lStack_178;
    auVar7._0_8_ = local_180;
    auVar8._8_8_ = lStack_168;
    auVar8._0_8_ = lStack_170;
    vpmaxsw_avx(auVar7,auVar8);
    mask[1] = (longlong)qcoeff1;
    mask[0] = (longlong)qcoeff0;
    uVar10 = calculate_non_zero_count(mask);
  }
  if ((local_1e0 & (undefined1  [32])0x1) == (undefined1  [32])0x0) {
    vpmaxsw_avx(local_2e0._0_16_,local_2e0._16_16_);
    mask_00[1] = (longlong)qcoeff1;
    mask_00[0] = (longlong)qcoeff0;
    iVar11 = calculate_non_zero_count(mask_00);
    uVar12 = iVar11 - 1;
  }
  else {
    uVar12 = 0xffffffff;
  }
  for (; (int)uVar10 <= (int)uVar12; uVar12 = uVar12 - 1) {
    sVar1 = scan[uVar12];
    qcoeff_ptr[sVar1] = 0;
    dqcoeff_ptr[sVar1] = 0;
  }
  uVar12 = uVar10 + 1;
  uVar15 = (ulong)uVar10;
  do {
    if ((long)uVar15 < 1) {
      uVar12 = 0;
      break;
    }
    lVar13 = uVar15 - 1;
    uVar15 = uVar15 - 1;
    uVar12 = uVar12 - 1;
  } while (qcoeff_ptr[scan[lVar13]] == 0);
  *eob_ptr = (uint16_t)uVar12;
  uVar15 = 0;
  uVar14 = 0xffffffff;
  do {
    if (uVar10 == uVar15) {
LAB_003181ed:
      if (((uint16_t)uVar12 != 0) && (uVar14 == (uVar12 & 0xffff) - 1)) {
        sVar1 = scan[uVar14];
        if (((qcoeff_ptr[sVar1] == 1) || (qcoeff_ptr[sVar1] == -1)) &&
           (uVar10 = coeff_ptr[sVar1] >> 0x1f, uVar15 = (ulong)((uint)(sVar1 != 0) * 2),
           (int)((coeff_ptr[sVar1] << 5 ^ uVar10) - uVar10) <
           *(short *)((long)local_250 + uVar15) * 0x20 +
           (*(short *)((long)dequant_ptr + uVar15) * 0x20d + 0x40 >> 7))) {
          qcoeff_ptr[sVar1] = 0;
          dqcoeff_ptr[sVar1] = 0;
          *eob_ptr = 0;
        }
      }
      return;
    }
    if (qcoeff_ptr[scan[uVar15]] != 0) {
      uVar14 = (uint)uVar15;
      goto LAB_003181ed;
    }
    uVar15 = uVar15 + 1;
  } while( true );
LAB_00318031:
  auVar17 = vpermq_avx2(auVar17,0xd8);
  auVar17 = vpand_avx2(auVar17,*(undefined1 (*) [32])(iscan + lVar6));
  local_2e0 = vpmaxsw_avx2(auVar17,local_2e0);
  qcoeff1 = &local_120;
  local_240 = alVar3;
  local_220 = alVar4;
  highbd_calculate_qcoeff_avx2(&local_280,qcoeff1,&local_200,&local_160,&local_2f0);
  qcoeff0 = &local_2a0;
  highbd_calculate_qcoeff_avx2(qcoeff0,qcoeff1,&local_200,&local_160,&local_2f0);
  auVar17 = vpsignd_avx2((undefined1  [32])local_280,(undefined1  [32])local_1a0);
  auVar2 = vpsignd_avx2((undefined1  [32])local_2a0,(undefined1  [32])local_1c0);
  local_280 = (__m256i)vpand_avx2(auVar17,(undefined1  [32])local_240);
  local_2a0 = (__m256i)vpand_avx2(auVar2,(undefined1  [32])local_220);
  *(__m256i *)(qcoeff_ptr + lVar6) = local_280;
  *(__m256i *)(qcoeff_ptr + lVar6 + 8) = local_2a0;
  auVar17 = vpmulld_avx2((undefined1  [32])local_280,local_2c0);
  auVar2 = vpmulld_avx2((undefined1  [32])local_2a0,local_2c0);
  *(undefined1 (*) [32])(dqcoeff_ptr + lVar6) = auVar17;
  *(undefined1 (*) [32])(dqcoeff_ptr + lVar6 + 8) = auVar2;
  auVar2._28_4_ = 0;
  auVar2._0_28_ = local_1e0._4_28_;
  local_1e0 = auVar2 << 0x20;
  goto LAB_00317f2c;
}

Assistant:

void aom_highbd_quantize_b_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff0, qcoeff0, coeff1, qcoeff1;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  int prescan_add[2];
  int thresh[2];
  const int log_scale = 0;
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  highbd_load_b_values_avx2(zbin_ptr, &zbin, round_ptr, &round, quant_ptr,
                            &quant, dequant_ptr, &dequant, quant_shift_ptr,
                            &shift);

  // Do DC and first 15 AC.
  coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr));
  qcoeff0 = _mm256_abs_epi32(coeff0);
  coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + 8));
  qcoeff1 = _mm256_abs_epi32(coeff1);
  highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0,
                           &mask0);
  __m256i temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm256_unpackhi_epi64(zbin, zbin);
  __m256i temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
  highbd_update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    // Reinsert signs
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    // Mask out zbin threshold coeffs
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr);
    coeff0 = highbd_calculate_dqcoeff_avx2(qcoeff0, dequant);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff_avx2(qcoeff1, dequant);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr + index));
    qcoeff0 = _mm256_abs_epi32(coeff0);
    coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + index + 8));
    qcoeff1 = _mm256_abs_epi32(coeff1);
    highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan + index,
                             &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
    temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
    highbd_update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr + index);
    coeff0 = highbd_calculate_dqcoeff_avx2(qcoeff0, dequant);
    coeff1 = highbd_calculate_dqcoeff_avx2(qcoeff1, dequant);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}